

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

void __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_false>::shl<unsigned_long>
          (uintwide_t<256U,_unsigned_int,_void,_false> *this,unsigned_long n)

{
  uint uVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar6 = 8;
  if (n >> 5 < 8) {
    uVar6 = n >> 5;
  }
  bVar2 = (byte)n & 0x1f;
  if (0x1f < n) {
    if (n < 0x100) {
      lVar3 = 0x20;
      do {
        *(undefined4 *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar3 + -4) =
             *(undefined4 *)((long)this + lVar3 + uVar6 * -4 + -4);
        lVar3 = lVar3 + -4;
      } while (uVar6 * -4 + lVar3 != 0);
    }
    memset(this,0,uVar6 * 4);
  }
  if (n < 0x100 && (n & 0x1f) != 0) {
    lVar3 = uVar6 << 2;
    uVar4 = 0;
    do {
      uVar1 = *(uint *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar3);
      uVar5 = uVar1 << bVar2 | uVar4;
      uVar4 = uVar1 >> (0x20 - bVar2 & 0x1f);
      *(uint *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar3) = uVar5;
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x20);
  }
  return;
}

Assistant:

constexpr auto shl(IntegralType n) -> void
    {
      const auto offset =
        (detail::min_unsafe)(static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) / static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits)),
                             static_cast<unsigned_fast_type>(number_of_limbs));

      const auto left_shift_amount = static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) % static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits));

      if(offset > static_cast<unsigned_fast_type>(UINT8_C(0)))
      {
        detail::copy_backward_unsafe(values.cbegin(),
                                     detail::advance_and_point(values.cbegin(), static_cast<size_t>(number_of_limbs - offset)),
                                     detail::advance_and_point(values.begin(), static_cast<size_t>(number_of_limbs)));

        detail::fill_unsafe(values.begin(), detail::advance_and_point(values.begin(), static_cast<size_t>(offset)), static_cast<limb_type>(UINT8_C(0)));
      }

      using local_integral_type = unsigned_fast_type;

      if(left_shift_amount != static_cast<local_integral_type>(UINT8_C(0)))
      {
        auto part_from_previous_value = static_cast<limb_type>(UINT8_C(0));

        auto ai = detail::advance_and_point(values.begin(), offset); // NOLINT(llvm-qualified-auto,readability-qualified-auto)

        while(ai != values.end()) // NOLINT(altera-id-dependent-backward-branch)
        {
          const auto t = *ai;

          *ai++ =
            static_cast<limb_type>
            (
                static_cast<limb_type>(t << static_cast<local_integral_type>(left_shift_amount))
              | part_from_previous_value
            );

          const auto right_shift_previous_value =
            static_cast<local_integral_type>
            (
              static_cast<unsigned_fast_type>
              (
                  static_cast<std::int_fast32_t>(std::numeric_limits<limb_type>::digits)
                - static_cast<std::int_fast32_t>(left_shift_amount)
              )
            );

          part_from_previous_value = static_cast<limb_type>(t >> right_shift_previous_value);
        }
      }
    }